

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool sx_strstr_wildcard(char *str,char *pattern)

{
  code *pcVar1;
  char *pcVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (str == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x176,"str");
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return (_Bool)uVar3;
  }
  if (pattern != (char *)0x0) {
    pcVar5 = (char *)0x0;
    pcVar2 = (char *)0x0;
    while( true ) {
      while (pcVar4 = pcVar2, *str != '\0') {
        if (pattern == (char *)0x0) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                            ,0x188,"pattern");
          pcVar1 = (code *)swi(3);
          uVar3 = (*pcVar1)();
          return (_Bool)uVar3;
        }
        pcVar2 = pcVar4;
        if (*pattern == *str) {
          str = str + 1;
          pattern = pattern + 1;
        }
        else if (*pattern == '*') {
          pcVar5 = pattern + 1;
          pcVar4 = pattern + 1;
          pcVar2 = str;
          pattern = pcVar5;
          if (*pcVar4 == '\0') {
            return true;
          }
        }
        else {
          if (pcVar5 == (char *)0x0) {
            return false;
          }
          str = str + 1;
        }
      }
      if (*pattern == '\0') {
        return true;
      }
      if (pcVar4 == (char *)0x0) break;
      if (*pcVar4 == '\0') {
        return false;
      }
      pcVar2 = pcVar4 + 1;
      str = pcVar4;
      pattern = pcVar5;
    }
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x181,"s");
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return (_Bool)uVar3;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x177,"pattern");
  pcVar1 = (code *)swi(3);
  uVar3 = (*pcVar1)();
  return (_Bool)uVar3;
}

Assistant:

bool sx_strstr_wildcard(const char* str, const char* pattern)
{
    sx_assert(str);
    sx_assert(pattern);

    const char* w = NULL;    // last `*`
    const char* s = NULL;    // last checked char

    // loop 1 char at a time
    while (1) {
        if (!*str) {
            if (!*pattern)
                return true;
            sx_assert(s);
            if (!*s)
                return false;
            str = s++;
            pattern = w;
            continue;
        } else {
            sx_assert(pattern);
            if (*pattern != *str) {
                if ('*' == *pattern) {
                    w = ++pattern;
                    s = str;
                    // "*" -> "foobar"
                    if (*pattern)
                        continue;
                    return true;
                } else if (w) {
                    str++;
                    // "*ooba*" -> "foobar"
                    continue;
                }
                return false;
            }
        }

        str++;
        pattern++;
    }

    return true;
}